

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multibranch.h
# Opt level: O0

int E_MLstem(int type,int si1,int sj1,vrna_param_t *P)

{
  int energy;
  vrna_param_t *P_local;
  int sj1_local;
  int si1_local;
  int type_local;
  
  energy = 0;
  if ((si1 < 0) || (sj1 < 0)) {
    if (si1 < 0) {
      if (-1 < sj1) {
        energy = P->dangle3[type][sj1];
      }
    }
    else {
      energy = P->dangle5[type][si1];
    }
  }
  else {
    energy = P->mismatchM[type][si1][sj1];
  }
  if (2 < type) {
    energy = P->TerminalAU + energy;
  }
  return P->MLintern[type] + energy;
}

Assistant:

PRIVATE INLINE int
E_MLstem(int          type,
         int          si1,
         int          sj1,
         vrna_param_t *P)
{
  int energy = 0;

  if (si1 >= 0 && sj1 >= 0)
    energy += P->mismatchM[type][si1][sj1];
  else if (si1 >= 0)
    energy += P->dangle5[type][si1];
  else if (sj1 >= 0)
    energy += P->dangle3[type][sj1];

  if (type > 2)
    energy += P->TerminalAU;

  energy += P->MLintern[type];

  return energy;
}